

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLMaterialLoader.cpp
# Opt level: O1

void __thiscall
Assimp::MDLImporter::ParseTextureColorData
          (MDLImporter *this,uchar *szData,uint iType,uint *piSkip,aiTexture *pcNew)

{
  byte bVar1;
  ushort uVar2;
  aiTexel *paVar3;
  uint uVar4;
  uchar (*in_RAX) [3];
  aiTexel *paVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uchar *szPos;
  uchar *szColorMap;
  uchar (*local_38) [3];
  
  paVar3 = pcNew->pcData;
  local_38 = in_RAX;
  if (paVar3 != (aiTexel *)0xffffffffffffffff) {
    paVar5 = (aiTexel *)operator_new__((ulong)(pcNew->mHeight * pcNew->mWidth) << 2);
    pcNew->pcData = paVar5;
  }
  uVar4 = iType | 8;
  if (uVar4 == 10) {
    SizeCheck(this,szData + pcNew->mWidth * pcNew->mHeight * 2,
              "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/MDL/MDLMaterialLoader.cpp"
              ,0xf9);
    uVar4 = pcNew->mHeight * pcNew->mWidth;
    uVar6 = (ulong)uVar4;
    if (paVar3 != (aiTexel *)0xffffffffffffffff) {
      if (uVar4 == 0) {
        uVar6 = 0;
      }
      else {
        uVar6 = 0;
        do {
          uVar2 = *(ushort *)(szData + uVar6 * 2);
          pcNew->pcData[uVar6].a = 0xff;
          pcNew->pcData[uVar6].r = (byte)(uVar2 >> 8) & 0xf8;
          pcNew->pcData[uVar6].g = (byte)(uVar2 >> 3) & 0xfc;
          pcNew->pcData[uVar6].b = (char)uVar2 << 3;
          uVar6 = uVar6 + 1;
        } while (uVar6 < pcNew->mHeight * pcNew->mWidth);
      }
    }
    uVar4 = (uint)uVar6;
    *piSkip = uVar4 * 2;
    if (iType == 10) {
      uVar4 = ((uVar4 >> 6) + ((uint)(uVar6 >> 2) & 0x3fffffff) +
              ((uint)(uVar6 >> 4) & 0xfffffff) + uVar4) * 2;
      *piSkip = uVar4;
      szPos = szData + uVar4;
      uVar4 = 0x111;
LAB_0045c099:
      SizeCheck(this,szPos,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/MDL/MDLMaterialLoader.cpp"
                ,uVar4);
      return;
    }
  }
  else if (uVar4 == 0xb) {
    SizeCheck(this,szData + pcNew->mWidth * pcNew->mHeight * 4,
              "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/MDL/MDLMaterialLoader.cpp"
              ,0x118);
    uVar4 = pcNew->mHeight * pcNew->mWidth;
    uVar6 = (ulong)uVar4;
    if (paVar3 != (aiTexel *)0xffffffffffffffff) {
      if (uVar4 == 0) {
        uVar6 = 0;
      }
      else {
        uVar6 = 0;
        do {
          uVar2 = *(ushort *)(szData + uVar6 * 2);
          pcNew->pcData[uVar6].a = (byte)uVar2 << 4;
          pcNew->pcData[uVar6].r = (byte)uVar2 & 0xf0;
          pcNew->pcData[uVar6].g = (byte)(uVar2 >> 4) & 0xf0;
          pcNew->pcData[uVar6].b = (byte)(uVar2 >> 8) & 0xf0;
          uVar6 = uVar6 + 1;
        } while (uVar6 < pcNew->mHeight * pcNew->mWidth);
      }
    }
    uVar4 = (uint)uVar6;
    *piSkip = uVar4 * 2;
    if (iType == 0xb) {
      uVar4 = ((uVar4 >> 6) + ((uint)(uVar6 >> 2) & 0x3fffffff) +
              ((uint)(uVar6 >> 4) & 0xfffffff) + uVar4) * 2;
      *piSkip = uVar4;
      szPos = szData + uVar4;
      uVar4 = 0x130;
      goto LAB_0045c099;
    }
  }
  else if (uVar4 == 0xc) {
    SizeCheck(this,szData + pcNew->mWidth * pcNew->mHeight * 3,
              "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/MDL/MDLMaterialLoader.cpp"
              ,0x137);
    uVar4 = pcNew->mHeight * pcNew->mWidth;
    uVar6 = (ulong)uVar4;
    if (paVar3 != (aiTexel *)0xffffffffffffffff) {
      if (uVar4 == 0) {
        uVar6 = 0;
      }
      else {
        uVar4 = 0;
        uVar6 = 0;
        do {
          pcNew->pcData[uVar6].a = 0xff;
          pcNew->pcData[uVar6].b = szData[uVar4];
          pcNew->pcData[uVar6].g = szData[(ulong)uVar4 + 1];
          pcNew->pcData[uVar6].r = szData[(ulong)uVar4 + 2];
          uVar6 = uVar6 + 1;
          uVar4 = uVar4 + 3;
        } while (uVar6 < pcNew->mHeight * pcNew->mWidth);
      }
    }
    uVar4 = (uint)uVar6;
    *piSkip = uVar4 * 3;
    if (iType == 0xc) {
      uVar4 = ((uVar4 >> 6) + ((uint)(uVar6 >> 2) & 0x3fffffff) +
              ((uint)(uVar6 >> 4) & 0xfffffff) + uVar4) * 3;
      *piSkip = uVar4;
      szPos = szData + uVar4;
      uVar4 = 0x14f;
      goto LAB_0045c099;
    }
  }
  else if (iType == 0) {
    SizeCheck(this,szData + pcNew->mHeight * pcNew->mWidth,
              "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/MDL/MDLMaterialLoader.cpp"
              ,0x173);
    if (paVar3 == (aiTexel *)0xffffffffffffffff) {
      uVar4 = pcNew->mHeight * pcNew->mWidth;
    }
    else {
      SearchPalette(this,(uchar **)&local_38);
      if (pcNew->mHeight * pcNew->mWidth == 0) {
        uVar6 = 0;
      }
      else {
        uVar6 = 0;
        do {
          bVar1 = szData[uVar6];
          pcNew->pcData[uVar6].a = 0xff;
          pcNew->pcData[uVar6].r = local_38[bVar1][0];
          pcNew->pcData[uVar6].g = local_38[bVar1][1];
          pcNew->pcData[uVar6].b = local_38[bVar1][2];
          uVar6 = uVar6 + 1;
        } while (uVar6 < pcNew->mHeight * pcNew->mWidth);
      }
      uVar4 = (uint)uVar6;
      if (local_38 != (uchar (*) [3])0x0 && local_38 != g_aclrDefaultColorMap) {
        operator_delete__(local_38);
      }
    }
    *piSkip = uVar4;
  }
  else if ((iType == 0xd) || (iType == 5)) {
    SizeCheck(this,szData + pcNew->mWidth * pcNew->mHeight * 4,
              "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/MDL/MDLMaterialLoader.cpp"
              ,0x156);
    uVar4 = pcNew->mHeight * pcNew->mWidth;
    uVar6 = (ulong)uVar4;
    if (paVar3 != (aiTexel *)0xffffffffffffffff) {
      if (uVar4 == 0) {
        uVar6 = 0;
      }
      else {
        uVar7 = 0;
        uVar6 = 0;
        do {
          uVar8 = uVar7 & 0xffffffff;
          (&pcNew->pcData->b)[uVar7] = szData[uVar8];
          (&pcNew->pcData->g)[uVar7] = szData[uVar8 + 1];
          (&pcNew->pcData->r)[uVar7] = szData[uVar8 + 2];
          (&pcNew->pcData->a)[uVar7] = szData[uVar8 + 3];
          uVar6 = uVar6 + 1;
          uVar7 = uVar7 + 4;
        } while (uVar6 < pcNew->mHeight * pcNew->mWidth);
      }
    }
    uVar4 = (uint)uVar6;
    if (iType == 0xd) {
      uVar4 = (uVar4 >> 6) + ((uint)(uVar6 >> 2) & 0x3fffffff) +
              ((uint)(uVar6 >> 4) & 0xfffffff) + uVar4;
    }
    *piSkip = uVar4 << 2;
  }
  return;
}

Assistant:

void MDLImporter::ParseTextureColorData(const unsigned char* szData,
    unsigned int iType,
    unsigned int* piSkip,
    aiTexture* pcNew)
{
    const bool do_read = bad_texel != pcNew->pcData;

    // allocate storage for the texture image
    if (do_read) {
        pcNew->pcData = new aiTexel[pcNew->mWidth * pcNew->mHeight];
    }

    // R5G6B5 format (with or without MIPs)
    // ****************************************************************
    if (2 == iType || 10 == iType)
    {
        VALIDATE_FILE_SIZE(szData + pcNew->mWidth*pcNew->mHeight*2);

        // copy texture data
        unsigned int i;
        if (do_read)
        {
            for (i = 0; i < pcNew->mWidth*pcNew->mHeight;++i)
            {
                MDL::RGB565 val = ((MDL::RGB565*)szData)[i];
                AI_SWAP2(val);

                pcNew->pcData[i].a = 0xFF;
                pcNew->pcData[i].r = (unsigned char)val.b << 3;
                pcNew->pcData[i].g = (unsigned char)val.g << 2;
                pcNew->pcData[i].b = (unsigned char)val.r << 3;
            }
        }
        else i = pcNew->mWidth*pcNew->mHeight;
        *piSkip = i * 2;

        // apply MIP maps
        if (10 == iType)
        {
            *piSkip += ((i >> 2) + (i >> 4) + (i >> 6)) << 1;
            VALIDATE_FILE_SIZE(szData + *piSkip);
        }
    }
    // ARGB4 format (with or without MIPs)
    // ****************************************************************
    else if (3 == iType || 11 == iType)
    {
        VALIDATE_FILE_SIZE(szData + pcNew->mWidth*pcNew->mHeight*4);

        // copy texture data
        unsigned int i;
        if (do_read)
        {
            for (i = 0; i < pcNew->mWidth*pcNew->mHeight;++i)
            {
                MDL::ARGB4 val = ((MDL::ARGB4*)szData)[i];
                AI_SWAP2(val);

                pcNew->pcData[i].a = (unsigned char)val.a << 4;
                pcNew->pcData[i].r = (unsigned char)val.r << 4;
                pcNew->pcData[i].g = (unsigned char)val.g << 4;
                pcNew->pcData[i].b = (unsigned char)val.b << 4;
            }
        }
        else i = pcNew->mWidth*pcNew->mHeight;
        *piSkip = i * 2;

        // apply MIP maps
        if (11 == iType)
        {
            *piSkip += ((i >> 2) + (i >> 4) + (i >> 6)) << 1;
            VALIDATE_FILE_SIZE(szData + *piSkip);
        }
    }
    // RGB8 format (with or without MIPs)
    // ****************************************************************
    else if (4 == iType || 12 == iType)
    {
        VALIDATE_FILE_SIZE(szData + pcNew->mWidth*pcNew->mHeight*3);

        // copy texture data
        unsigned int i;
        if (do_read)
        {
            for (i = 0; i < pcNew->mWidth*pcNew->mHeight;++i)
            {
                const unsigned char* _szData = &szData[i*3];

                pcNew->pcData[i].a = 0xFF;
                pcNew->pcData[i].b = *_szData++;
                pcNew->pcData[i].g = *_szData++;
                pcNew->pcData[i].r = *_szData;
            }
        }
        else i = pcNew->mWidth*pcNew->mHeight;


        // apply MIP maps
        *piSkip = i * 3;
        if (12 == iType)
        {
            *piSkip += ((i >> 2) + (i >> 4) + (i >> 6)) *3;
            VALIDATE_FILE_SIZE(szData + *piSkip);
        }
    }
    // ARGB8 format (with ir without MIPs)
    // ****************************************************************
    else if (5 == iType || 13 == iType)
    {
        VALIDATE_FILE_SIZE(szData + pcNew->mWidth*pcNew->mHeight*4);

        // copy texture data
        unsigned int i;
        if (do_read)
        {
            for (i = 0; i < pcNew->mWidth*pcNew->mHeight;++i)
            {
                const unsigned char* _szData = &szData[i*4];

                pcNew->pcData[i].b = *_szData++;
                pcNew->pcData[i].g = *_szData++;
                pcNew->pcData[i].r = *_szData++;
                pcNew->pcData[i].a = *_szData;
            }
        }
        else i = pcNew->mWidth*pcNew->mHeight;

        // apply MIP maps
        *piSkip = i << 2;
        if (13 == iType)
        {
            *piSkip += ((i >> 2) + (i >> 4) + (i >> 6)) << 2;
        }
    }
    // palletized 8 bit texture. As for Quake 1
    // ****************************************************************
    else if (0 == iType)
    {
        VALIDATE_FILE_SIZE(szData + pcNew->mWidth*pcNew->mHeight);

        // copy texture data
        unsigned int i;
        if (do_read)
        {

            const unsigned char* szColorMap;
            SearchPalette(&szColorMap);

            for (i = 0; i < pcNew->mWidth*pcNew->mHeight;++i)
            {
                const unsigned char val = szData[i];
                const unsigned char* sz = &szColorMap[val*3];

                pcNew->pcData[i].a = 0xFF;
                pcNew->pcData[i].r = *sz++;
                pcNew->pcData[i].g = *sz++;
                pcNew->pcData[i].b = *sz;
            }
            this->FreePalette(szColorMap);

        }
        else i = pcNew->mWidth*pcNew->mHeight;
        *piSkip = i;

        // FIXME: Also support for MIP maps?
    }
}